

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void bestIndex(WhereBestIdx *p)

{
  sqlite3_index_info *pIdxInfo;
  sqlite3_index_info *local_18;
  
  if ((p->pSrc->pTab->tabFlags & 0x10) == 0) {
    bestBtreeIndex(p);
    return;
  }
  local_18 = (sqlite3_index_info *)0x0;
  p->ppIdxInfo = &local_18;
  bestVirtualIndex(p);
  if ((local_18 != (sqlite3_index_info *)0x0) && (local_18->needToFreeIdxStr != 0)) {
    sqlite3_free(local_18->idxStr);
  }
  sqlite3DbFree(p->pParse->db,local_18);
  return;
}

Assistant:

static void bestIndex(WhereBestIdx *p){
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(p->pSrc->pTab) ){
    sqlite3_index_info *pIdxInfo = 0;
    p->ppIdxInfo = &pIdxInfo;
    bestVirtualIndex(p);
    assert( pIdxInfo!=0 || p->pParse->db->mallocFailed );
    if( pIdxInfo && pIdxInfo->needToFreeIdxStr ){
      sqlite3_free(pIdxInfo->idxStr);
    }
    sqlite3DbFree(p->pParse->db, pIdxInfo);
  }else
#endif
  {
    bestBtreeIndex(p);
  }
}